

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O3

LineInterpolationRange __thiscall
tcu::(anonymous_namespace)::
calcSingleSampleLineInterpolationRangeWithWeightEquation<tcu::(anonymous_namespace)::LineInterpolationRange(*)(tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&)>
          (_anonymous_namespace_ *this,Vec2 *pa,float wa,Vec2 *pb,float wb,IVec2 *pixel,
          int subpixelBits,
          _func_LineInterpolationRange_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr_float_Vector<float,_2>_ptr
          *weightEquation)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Vec2 VVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  float fVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  LineInterpolationRange LVar14;
  code *in_stack_00000008;
  LineInterpolationRange weights [4];
  float local_98;
  undefined8 local_94;
  float local_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float local_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 auStack_68 [8];
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  undefined8 local_50;
  float local_48;
  float fStack_44;
  undefined8 uStack_40;
  
  fStack_80 = (float)((int)weightEquation * -0x800000 + 0x40000000);
  local_98 = 0.5 - fStack_80 * 0.5;
  local_7c = local_98 + (float)subpixelBits;
  local_98 = local_98 + (float)(int)pixel;
  local_94 = CONCAT44(local_98,local_7c);
  local_8c = local_7c + fStack_80;
  fStack_88 = local_98 + fStack_80;
  fStack_84 = local_7c + fStack_80;
  fStack_80 = local_98 + fStack_80;
  (*in_stack_00000008)(&local_78,pa,pb,&local_98,subpixelBits,(int)weightEquation * 0x800000,wa);
  (*in_stack_00000008)(auStack_68,pa,pb,(long)&local_94 + 4);
  (*in_stack_00000008)(&fStack_58,pa,pb,&fStack_88);
  (*in_stack_00000008)(&local_48,pa,pb,&fStack_80);
  fVar10 = (float)((ulong)local_50 >> 0x20);
  fVar13 = (float)((ulong)uStack_40 >> 0x20);
  uVar5 = -(uint)(auStack_68._0_4_ <= local_78);
  uVar6 = -(uint)(auStack_68._4_4_ <= fStack_74);
  uVar7 = -(uint)((float)local_50 <= (float)uStack_40);
  uVar8 = -(uint)(fVar10 <= fVar13);
  auVar9._0_4_ = ~uVar5 & (uint)auStack_68._0_4_;
  auVar9._4_4_ = ~uVar6 & (uint)auStack_68._4_4_;
  auVar9._8_4_ = ~uVar7 & (uint)(float)uStack_40;
  auVar9._12_4_ = ~uVar8 & (uint)fVar13;
  auVar4._4_4_ = (uint)fStack_74 & uVar6;
  auVar4._0_4_ = (uint)local_78 & uVar5;
  auVar4._8_4_ = (uint)(float)local_50 & uVar7;
  auVar4._12_4_ = (uint)fVar10 & uVar8;
  auVar9 = auVar9 | auVar4;
  auVar12._0_4_ = ~-(uint)(fStack_70 <= local_60) & (uint)local_60;
  auVar12._4_4_ = ~-(uint)(fStack_6c <= fStack_5c) & (uint)fStack_5c;
  auVar12._8_4_ = ~-(uint)(local_48 <= fStack_58) & (uint)local_48;
  auVar12._12_4_ = ~-(uint)(fStack_44 <= fStack_54) & (uint)fStack_44;
  auVar1._4_4_ = (uint)fStack_6c & -(uint)(fStack_6c <= fStack_5c);
  auVar1._0_4_ = (uint)fStack_70 & -(uint)(fStack_70 <= local_60);
  auVar1._8_4_ = (uint)fStack_58 & -(uint)(local_48 <= fStack_58);
  auVar1._12_4_ = (uint)fStack_54 & -(uint)(fStack_44 <= fStack_54);
  auVar12 = auVar12 | auVar1;
  auVar11._0_8_ =
       CONCAT44(-(uint)(auVar12._12_4_ <= auVar9._4_4_),-(uint)(auVar12._8_4_ <= auVar9._0_4_));
  auVar11._8_4_ = -(uint)(auVar12._0_4_ <= auVar9._8_4_);
  auVar11._12_4_ = -(uint)(auVar12._4_4_ <= auVar9._12_4_);
  VVar3.m_data = auVar12._8_8_;
  auVar2._8_4_ = auVar12._0_4_;
  auVar2._0_4_ = VVar3.m_data[0];
  auVar2._4_4_ = VVar3.m_data[1];
  auVar2._12_4_ = auVar12._4_4_;
  *(ulong *)this = ~auVar11._0_8_ & (ulong)VVar3.m_data | auVar9._0_8_ & auVar11._0_8_;
  *(ulong *)(this + 8) = ~auVar11._8_8_ & auVar9._8_8_ | auVar2._8_8_ & auVar11._8_8_;
  LVar14.min.m_data[0] = VVar3.m_data[0];
  LVar14.min.m_data[1] = VVar3.m_data[1];
  LVar14.max.m_data[0] = VVar3.m_data[0];
  LVar14.max.m_data[1] = VVar3.m_data[1];
  return LVar14;
}

Assistant:

LineInterpolationRange calcSingleSampleLineInterpolationRangeWithWeightEquation (const tcu::Vec2&	pa,
																				 float				wa,
																				 const tcu::Vec2&	pb,
																				 float				wb,
																				 const tcu::IVec2&	pixel,
																				 int				subpixelBits,
																				 WeightEquation		weightEquation)
{
	// allow interpolation weights anywhere in the central subpixels
	const float testSquareSize = (2.0f / (float)(1UL << subpixelBits));
	const float testSquarePos  = (0.5f - testSquareSize / 2);

	const tcu::Vec2 corners[4] =
	{
		tcu::Vec2((float)pixel.x() + testSquarePos + 0.0f,				(float)pixel.y() + testSquarePos + 0.0f),
		tcu::Vec2((float)pixel.x() + testSquarePos + 0.0f,				(float)pixel.y() + testSquarePos + testSquareSize),
		tcu::Vec2((float)pixel.x() + testSquarePos + testSquareSize,	(float)pixel.y() + testSquarePos + testSquareSize),
		tcu::Vec2((float)pixel.x() + testSquarePos + testSquareSize,	(float)pixel.y() + testSquarePos + 0.0f),
	};

	// calculate interpolation as a line
	const LineInterpolationRange weights[4] =
	{
		weightEquation(pa, wa, pb, wb, corners[0]),
		weightEquation(pa, wa, pb, wb, corners[1]),
		weightEquation(pa, wa, pb, wb, corners[2]),
		weightEquation(pa, wa, pb, wb, corners[3]),
	};

	const tcu::Vec2 minWeights = tcu::min(tcu::min(weights[0].min, weights[1].min), tcu::min(weights[2].min, weights[3].min));
	const tcu::Vec2 maxWeights = tcu::max(tcu::max(weights[0].max, weights[1].max), tcu::max(weights[2].max, weights[3].max));

	LineInterpolationRange result;
	result.min = minWeights;
	result.max = maxWeights;
	return result;
}